

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

int util::compareChar(char *str1,char *str2)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar1 = strlen(str1);
  sVar2 = strlen(str2);
  sVar4 = sVar1;
  if (sVar2 < sVar1) {
    sVar4 = sVar2;
  }
  if (sVar4 != 0) {
    sVar5 = 0;
    do {
      if (str1[sVar5] < str2[sVar5]) {
        return -1;
      }
      if (str2[sVar5] < str1[sVar5]) {
        return 1;
      }
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
  }
  uVar3 = 0xffffffff;
  if (sVar2 <= sVar1) {
    uVar3 = (uint)(sVar2 != sVar1);
  }
  return uVar3;
}

Assistant:

int util::compareChar(const char* str1, const char* str2){

    for(int i = 0 ; i < min(strlen(str1), strlen(str2)); i++){
        if(str1[i] < str2[i])
            return -1;
        else if (str1[i] > str2[i])
            return 1;
    }
    if(strlen(str2) > strlen(str1))
        return -1;
    else if(strlen(str2) == strlen(str1))
        return 0;
    return 1;
}